

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpushbutton.cpp
# Opt level: O1

void __thiscall QPushButton::setDefault(QPushButton *this,bool enable)

{
  QPushButtonPrivate *this_00;
  QDialog *pQVar1;
  long in_FS_OFFSET;
  QAccessibleStateChangeEvent event;
  code *local_48;
  undefined8 uStack_40;
  QPushButton *local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QPushButtonPrivate **)&(this->super_QAbstractButton).super_QWidget.field_0x8;
  if (((this_00->field_0x2c8 & 4) == 0) == enable) {
    this_00->field_0x2c8 = this_00->field_0x2c8 & 0xfb | enable * '\x04';
    if (enable) {
      pQVar1 = QPushButtonPrivate::dialogParent(this_00);
      if (pQVar1 != (QDialog *)0x0) {
        QDialogPrivate::setMainDefault(*(QDialogPrivate **)&(pQVar1->super_QWidget).field_0x8,this);
      }
    }
    QWidget::update((QWidget *)this);
    uStack_30 = 0xaaaaaaaaffffffff;
    local_48 = QCss::ValueExtractor::extractGeometry;
    local_28 = 0x400;
    uStack_40 = 0xaaaaaaaa0000800a;
    local_38 = this;
    QAccessible::updateAccessibility((QAccessibleEvent *)&local_48);
    QAccessibleStateChangeEvent::~QAccessibleStateChangeEvent
              ((QAccessibleStateChangeEvent *)&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPushButton::setDefault(bool enable)
{
    Q_D(QPushButton);
    if (d->defaultButton == enable)
        return;
    d->defaultButton = enable;
#if QT_CONFIG(dialog)
    if (d->defaultButton) {
        if (QDialog *dlg = d->dialogParent())
            dlg->d_func()->setMainDefault(this);
    }
#endif
    update();
#if QT_CONFIG(accessibility)
    QAccessible::State s;
    s.defaultButton = true;
    QAccessibleStateChangeEvent event(this, s);
    QAccessible::updateAccessibility(&event);
#endif
}